

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void opj_jp2_apply_cdef(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *manager)

{
  ushort uVar1;
  OPJ_UINT16 OVar2;
  ushort uVar3;
  opj_jp2_cdef_info_t *poVar4;
  ushort local_7a;
  undefined1 local_78 [6];
  OPJ_UINT16 j;
  opj_image_comp_t saved;
  OPJ_UINT16 acn;
  OPJ_UINT16 asoc;
  OPJ_UINT16 cn;
  OPJ_UINT16 n;
  OPJ_UINT16 i;
  opj_jp2_cdef_info_t *info;
  opj_event_mgr_t *manager_local;
  opj_jp2_color_t *color_local;
  opj_image_t *image_local;
  
  poVar4 = color->jp2_cdef->info;
  uVar1 = color->jp2_cdef->n;
  for (acn = 0; acn < uVar1; acn = acn + 1) {
    OVar2 = poVar4[acn].asoc;
    uVar3 = poVar4[acn].cn;
    if ((uint)uVar3 < image->numcomps) {
      if ((OVar2 == 0) || (OVar2 == 0xffff)) {
        image->comps[uVar3].alpha = poVar4[acn].typ;
      }
      else {
        saved._62_2_ = OVar2 - 1;
        if ((uint)(ushort)saved._62_2_ < image->numcomps) {
          if ((uVar3 != saved._62_2_) && (poVar4[acn].typ == 0)) {
            memcpy(local_78,image->comps + uVar3,0x40);
            memcpy(image->comps + uVar3,image->comps + (ushort)saved._62_2_,0x40);
            memcpy(image->comps + (ushort)saved._62_2_,local_78,0x40);
            local_7a = acn;
            while (local_7a = local_7a + 1, local_7a < uVar1) {
              if (poVar4[local_7a].cn == uVar3) {
                poVar4[local_7a].cn = saved._62_2_;
              }
              else if (poVar4[local_7a].cn == saved._62_2_) {
                poVar4[local_7a].cn = uVar3;
              }
            }
          }
          image->comps[uVar3].alpha = poVar4[acn].typ;
        }
        else {
          opj_event_msg(manager,2,"opj_jp2_apply_cdef: acn=%d, numcomps=%d\n",
                        (ulong)(ushort)saved._62_2_,(ulong)image->numcomps);
        }
      }
    }
    else {
      opj_event_msg(manager,2,"opj_jp2_apply_cdef: cn=%d, numcomps=%d\n",(ulong)uVar3,
                    (ulong)image->numcomps);
    }
  }
  if (color->jp2_cdef->info != (opj_jp2_cdef_info_t *)0x0) {
    opj_free(color->jp2_cdef->info);
  }
  opj_free(color->jp2_cdef);
  color->jp2_cdef = (opj_jp2_cdef_t *)0x0;
  return;
}

Assistant:

static void opj_jp2_apply_cdef(opj_image_t *image, opj_jp2_color_t *color,
                               opj_event_mgr_t *manager)
{
    opj_jp2_cdef_info_t *info;
    OPJ_UINT16 i, n, cn, asoc, acn;

    info = color->jp2_cdef->info;
    n = color->jp2_cdef->n;

    for (i = 0; i < n; ++i) {
        /* WATCH: acn = asoc - 1 ! */
        asoc = info[i].asoc;
        cn = info[i].cn;

        if (cn >= image->numcomps) {
            opj_event_msg(manager, EVT_WARNING, "opj_jp2_apply_cdef: cn=%d, numcomps=%d\n",
                          cn, image->numcomps);
            continue;
        }
        if (asoc == 0 || asoc == 65535) {
            image->comps[cn].alpha = info[i].typ;
            continue;
        }

        acn = (OPJ_UINT16)(asoc - 1);
        if (acn >= image->numcomps) {
            opj_event_msg(manager, EVT_WARNING, "opj_jp2_apply_cdef: acn=%d, numcomps=%d\n",
                          acn, image->numcomps);
            continue;
        }

        /* Swap only if color channel */
        if ((cn != acn) && (info[i].typ == 0)) {
            opj_image_comp_t saved;
            OPJ_UINT16 j;

            memcpy(&saved, &image->comps[cn], sizeof(opj_image_comp_t));
            memcpy(&image->comps[cn], &image->comps[acn], sizeof(opj_image_comp_t));
            memcpy(&image->comps[acn], &saved, sizeof(opj_image_comp_t));

            /* Swap channels in following channel definitions, don't bother with j <= i that are already processed */
            for (j = (OPJ_UINT16)(i + 1U); j < n ; ++j) {
                if (info[j].cn == cn) {
                    info[j].cn = acn;
                } else if (info[j].cn == acn) {
                    info[j].cn = cn;
                }
                /* asoc is related to color index. Do not update. */
            }
        }

        image->comps[cn].alpha = info[i].typ;
    }

    if (color->jp2_cdef->info) {
        opj_free(color->jp2_cdef->info);
    }

    opj_free(color->jp2_cdef);
    color->jp2_cdef = NULL;

}